

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheatSheet_foo_Test::TEST_MockCheatSheet_foo_Test(TEST_MockCheatSheet_foo_Test *this)

{
  TEST_MockCheatSheet_foo_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockCheatSheet::TEST_GROUP_CppUTestGroupMockCheatSheet
            (&this->super_TEST_GROUP_CppUTestGroupMockCheatSheet);
  (this->super_TEST_GROUP_CppUTestGroupMockCheatSheet).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockCheatSheet_foo_Test_00331238;
  return;
}

Assistant:

TEST(MockCheatSheet, foo)
{
    /* Record 2 calls to Foo. Return different values on each call */
    mock().expectOneCall("Foo")
        .withParameter("param_string", "value_string")
        .withParameter("param_int", 10)
        .andReturnValue(30);
    mock().expectOneCall("Foo")
        .ignoreOtherParameters()
        .andReturnValue(50);

    /* Call production code */
    productionCodeFooCalls();
}